

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t functionExpression
          ,sysbvm_tuple_t arguments)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_astFunctionApplicationNode_t *result;
  sysbvm_tuple_t arguments_local;
  sysbvm_tuple_t functionExpression_local;
  sysbvm_tuple_t sourcePosition_local;
  sysbvm_context_t *context_local;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).astFunctionApplicationNodeType,6);
  (psVar1->field_1).pointers[0] = sourcePosition;
  psVar1[1].field_1.pointers[0] = functionExpression;
  psVar1[2].header.field_0.typePointer = arguments;
  sVar2 = sysbvm_tuple_bitflags_encode(0);
  psVar1[2].header.identityHashAndFlags = (int)sVar2;
  psVar1[2].header.objectSize = (int)(sVar2 >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astFunctionApplicationNode_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t functionExpression, sysbvm_tuple_t arguments)
{
    sysbvm_astFunctionApplicationNode_t *result = (sysbvm_astFunctionApplicationNode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.astFunctionApplicationNodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_astFunctionApplicationNode_t));
    result->super.sourcePosition = sourcePosition;
    result->functionExpression = functionExpression;
    result->arguments = arguments;
    result->applicationFlags = sysbvm_tuple_bitflags_encode(0);
    return (sysbvm_tuple_t)result;
}